

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall
capnp::compiler::Compiler::Node::traverseNodeDependencies
          (Node *this,Reader *schemaNode,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  ushort uVar1;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  *seen_00;
  ListElementCount LVar2;
  WirePointer depId;
  WirePointer depId_00;
  ElementCount EVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Reader superclass;
  StructReader local_118;
  PointerReader local_e8;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  *local_c0;
  Reader *local_b8;
  int local_ac;
  SegmentReader *local_a8;
  WirePointer *local_a0;
  CapTableReader *local_98;
  ListReader local_90;
  ListReader local_60;
  
  if (0x6f < (schemaNode->_reader).dataSize) {
    switch(*(undefined2 *)((long)(schemaNode->_reader).data + 0xc)) {
    case 1:
      bVar4 = 3 < (schemaNode->_reader).pointerCount;
      local_118.data = (schemaNode->_reader).pointers + 3;
      if (!bVar4) {
        local_118.data = (WirePointer *)0x0;
      }
      local_118.pointers._0_4_ = (schemaNode->_reader).nestingLimit;
      if (bVar4) {
        uVar5 = *(undefined4 *)&(schemaNode->_reader).segment;
        uVar6 = *(undefined4 *)((long)&(schemaNode->_reader).segment + 4);
        uVar7 = *(undefined4 *)&(schemaNode->_reader).capTable;
        uVar8 = *(undefined4 *)((long)&(schemaNode->_reader).capTable + 4);
      }
      else {
        uVar5 = 0;
        uVar6 = 0;
        uVar7 = 0;
        uVar8 = 0;
        local_118.pointers._0_4_ = 0x7fffffff;
      }
      local_118.segment = (SegmentReader *)CONCAT44(uVar6,uVar5);
      local_118.capTable = (CapTableReader *)CONCAT44(uVar8,uVar7);
      local_b8 = schemaNode;
      capnp::_::PointerReader::getList
                (&local_90,(PointerReader *)&local_118,INLINE_COMPOSITE,(word *)0x0);
      local_c0 = (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                  *)CONCAT44(local_c0._4_4_,local_90.elementCount);
      schemaNode = local_b8;
      if (local_90.elementCount != 0) {
        EVar3 = 0;
        do {
          capnp::_::ListReader::getStructElement(&local_118,&local_90,EVar3);
          if ((local_118.dataSize < 0x50) ||
             ((short)(((WirePointer *)((long)local_118.data + 8))->offsetAndKind).value == 0)) {
            local_e8.pointer =
                 (WirePointer *)(CONCAT44(local_118.pointers._4_4_,(int)local_118.pointers) + 0x10);
            if (local_118.pointerCount < 3) {
              local_e8.pointer = (WirePointer *)0x0;
              local_e8.segment._0_4_ = 0;
              local_e8.segment._4_4_ = 0;
              local_e8.capTable._0_4_ = 0;
              local_e8.capTable._4_4_ = 0;
              local_e8.nestingLimit = 0x7fffffff;
            }
            else {
              local_e8.segment._0_4_ = local_118.segment._0_4_;
              local_e8.segment._4_4_ = local_118.segment._4_4_;
              local_e8.capTable._0_4_ = local_118.capTable._0_4_;
              local_e8.capTable._4_4_ = local_118.capTable._4_4_;
              local_e8.nestingLimit = local_118.nestingLimit;
            }
            capnp::_::PointerReader::getStruct((StructReader *)&local_60,&local_e8,(word *)0x0);
            traverseType(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
          }
          local_e8.pointer =
               (WirePointer *)(CONCAT44(local_118.pointers._4_4_,(int)local_118.pointers) + 8);
          if (local_118.pointerCount < 2) {
            local_e8.pointer = (WirePointer *)0x0;
            local_e8.segment._0_4_ = 0;
            local_e8.segment._4_4_ = 0;
            local_e8.capTable._0_4_ = 0;
            local_e8.capTable._4_4_ = 0;
            local_e8.nestingLimit = 0x7fffffff;
          }
          else {
            local_e8.segment._0_4_ = local_118.segment._0_4_;
            local_e8.segment._4_4_ = local_118.segment._4_4_;
            local_e8.capTable._0_4_ = local_118.capTable._0_4_;
            local_e8.capTable._4_4_ = local_118.capTable._4_4_;
            local_e8.nestingLimit = local_118.nestingLimit;
          }
          capnp::_::PointerReader::getList(&local_60,&local_e8,INLINE_COMPOSITE,(word *)0x0);
          traverseAnnotations(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
          EVar3 = EVar3 + 1;
          schemaNode = local_b8;
        } while ((ElementCount)local_c0 != EVar3);
      }
      break;
    case 2:
      bVar4 = 3 < (schemaNode->_reader).pointerCount;
      local_118.data = (schemaNode->_reader).pointers + 3;
      if (!bVar4) {
        local_118.data = (WirePointer *)0x0;
      }
      local_118.pointers._0_4_ = (schemaNode->_reader).nestingLimit;
      if (bVar4) {
        uVar5 = *(undefined4 *)&(schemaNode->_reader).segment;
        uVar6 = *(undefined4 *)((long)&(schemaNode->_reader).segment + 4);
        uVar7 = *(undefined4 *)&(schemaNode->_reader).capTable;
        uVar8 = *(undefined4 *)((long)&(schemaNode->_reader).capTable + 4);
      }
      else {
        uVar5 = 0;
        uVar6 = 0;
        uVar7 = 0;
        uVar8 = 0;
        local_118.pointers._0_4_ = 0x7fffffff;
      }
      local_118.segment = (SegmentReader *)CONCAT44(uVar6,uVar5);
      local_118.capTable = (CapTableReader *)CONCAT44(uVar8,uVar7);
      local_b8 = schemaNode;
      capnp::_::PointerReader::getList
                (&local_90,(PointerReader *)&local_118,INLINE_COMPOSITE,(word *)0x0);
      schemaNode = local_b8;
      if (local_90.elementCount != 0) {
        EVar3 = 0;
        do {
          capnp::_::ListReader::getStructElement(&local_118,&local_90,EVar3);
          local_e8.pointer =
               (WirePointer *)(CONCAT44(local_118.pointers._4_4_,(int)local_118.pointers) + 8);
          if (local_118.pointerCount < 2) {
            local_e8.pointer = (WirePointer *)0x0;
            local_e8.segment._0_4_ = 0;
            local_e8.segment._4_4_ = 0;
            local_e8.capTable._0_4_ = 0;
            local_e8.capTable._4_4_ = 0;
            local_e8.nestingLimit = 0x7fffffff;
          }
          else {
            local_e8.segment._0_4_ = local_118.segment._0_4_;
            local_e8.segment._4_4_ = local_118.segment._4_4_;
            local_e8.capTable._0_4_ = local_118.capTable._0_4_;
            local_e8.capTable._4_4_ = local_118.capTable._4_4_;
            local_e8.nestingLimit = local_118.nestingLimit;
          }
          capnp::_::PointerReader::getList(&local_60,&local_e8,INLINE_COMPOSITE,(word *)0x0);
          traverseAnnotations(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
          EVar3 = EVar3 + 1;
          schemaNode = local_b8;
        } while (local_90.elementCount != EVar3);
      }
      break;
    case 3:
      local_a8 = (schemaNode->_reader).segment;
      local_98 = (schemaNode->_reader).capTable;
      local_a0 = (schemaNode->_reader).pointers;
      uVar1 = (schemaNode->_reader).pointerCount;
      local_ac = (schemaNode->_reader).nestingLimit;
      if (uVar1 < 5) {
        local_118.pointers._0_4_ = 0x7fffffff;
        local_118.capTable = (CapTableReader *)0x0;
        local_118.data = (WirePointer *)0x0;
        local_118.segment = (SegmentReader *)0x0;
      }
      else {
        local_118.data = local_a0 + 4;
        local_118.capTable = local_98;
        local_118.segment = local_a8;
        local_118.pointers._0_4_ = local_ac;
      }
      local_b8 = schemaNode;
      capnp::_::PointerReader::getList
                (&local_90,(PointerReader *)&local_118,INLINE_COMPOSITE,(word *)0x0);
      LVar2 = local_90.elementCount;
      if (local_90.elementCount != 0) {
        EVar3 = 0;
        do {
          capnp::_::ListReader::getStructElement(&local_118,&local_90,EVar3);
          if ((0x3f < local_118.dataSize) && (*local_118.data != (WirePointer)0x0)) {
            traverseDependency(this,(uint64_t)*local_118.data,eagerness,seen,finalLoader,sourceInfo,
                               false);
          }
          local_e8.pointer =
               (WirePointer *)CONCAT44(local_118.pointers._4_4_,(int)local_118.pointers);
          local_e8.nestingLimit = local_118.nestingLimit;
          if (local_118.pointerCount == 0) {
            local_e8.pointer = (WirePointer *)0x0;
            local_e8.nestingLimit = 0x7fffffff;
          }
          local_e8.segment._0_4_ = 0;
          local_e8.segment._4_4_ = 0;
          local_e8.capTable._0_4_ = 0;
          local_e8.capTable._4_4_ = 0;
          if (local_118.pointerCount != 0) {
            local_e8.segment._0_4_ = local_118.segment._0_4_;
            local_e8.segment._4_4_ = local_118.segment._4_4_;
            local_e8.capTable._0_4_ = local_118.capTable._0_4_;
            local_e8.capTable._4_4_ = local_118.capTable._4_4_;
          }
          capnp::_::PointerReader::getStruct((StructReader *)&local_60,&local_e8,(word *)0x0);
          traverseBrand(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
          EVar3 = EVar3 + 1;
        } while (LVar2 != EVar3);
      }
      if (uVar1 < 4) {
        local_118.pointers._0_4_ = 0x7fffffff;
        local_118.capTable = (CapTableReader *)0x0;
        local_118.data = (WirePointer *)0x0;
        local_118.segment = (SegmentReader *)0x0;
      }
      else {
        local_118.data = local_a0 + 3;
        local_118.capTable = local_98;
        local_118.segment = local_a8;
        local_118.pointers._0_4_ = local_ac;
      }
      local_c0 = seen;
      capnp::_::PointerReader::getList
                (&local_90,(PointerReader *)&local_118,INLINE_COMPOSITE,(word *)0x0);
      seen = local_c0;
      schemaNode = local_b8;
      if (local_90.elementCount != 0) {
        EVar3 = 0;
        do {
          capnp::_::ListReader::getStructElement(&local_118,&local_90,EVar3);
          seen_00 = local_c0;
          if (local_118.dataSize < 0x80) {
            depId.offsetAndKind.value = 0;
            depId.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          }
          else {
            depId = *(WirePointer *)((long)local_118.data + 8);
          }
          traverseDependency(this,(uint64_t)depId,eagerness,local_c0,finalLoader,sourceInfo,true);
          local_e8.pointer =
               (WirePointer *)(CONCAT44(local_118.pointers._4_4_,(int)local_118.pointers) + 0x10);
          if (local_118.pointerCount < 3) {
            local_e8.pointer = (WirePointer *)0x0;
            local_e8.segment._0_4_ = 0;
            local_e8.segment._4_4_ = 0;
            local_e8.capTable._0_4_ = 0;
            local_e8.capTable._4_4_ = 0;
            local_e8.nestingLimit = 0x7fffffff;
          }
          else {
            local_e8.segment._0_4_ = local_118.segment._0_4_;
            local_e8.segment._4_4_ = local_118.segment._4_4_;
            local_e8.capTable._0_4_ = local_118.capTable._0_4_;
            local_e8.capTable._4_4_ = local_118.capTable._4_4_;
            local_e8.nestingLimit = local_118.nestingLimit;
          }
          capnp::_::PointerReader::getStruct((StructReader *)&local_60,&local_e8,(word *)0x0);
          traverseBrand(this,(Reader *)&local_60,eagerness,seen_00,finalLoader,sourceInfo);
          depId_00.offsetAndKind.value = 0;
          depId_00.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          if (0xbf < local_118.dataSize) {
            depId_00 = *(WirePointer *)((long)local_118.data + 0x10);
          }
          traverseDependency(this,(uint64_t)depId_00,eagerness,seen_00,finalLoader,sourceInfo,true);
          local_e8.pointer =
               (WirePointer *)(CONCAT44(local_118.pointers._4_4_,(int)local_118.pointers) + 0x18);
          if (local_118.pointerCount < 4) {
            local_e8.pointer = (WirePointer *)0x0;
          }
          if (local_118.pointerCount < 4) {
            local_e8.segment._0_4_ = 0;
            local_e8.segment._4_4_ = 0;
            local_e8.capTable._0_4_ = 0;
            local_e8.capTable._4_4_ = 0;
            local_e8.nestingLimit = 0x7fffffff;
          }
          else {
            local_e8.segment._0_4_ = local_118.segment._0_4_;
            local_e8.segment._4_4_ = local_118.segment._4_4_;
            local_e8.capTable._0_4_ = local_118.capTable._0_4_;
            local_e8.capTable._4_4_ = local_118.capTable._4_4_;
            local_e8.nestingLimit = local_118.nestingLimit;
          }
          capnp::_::PointerReader::getStruct((StructReader *)&local_60,&local_e8,(word *)0x0);
          traverseBrand(this,(Reader *)&local_60,eagerness,local_c0,finalLoader,sourceInfo);
          local_e8.pointer =
               (WirePointer *)(CONCAT44(local_118.pointers._4_4_,(int)local_118.pointers) + 8);
          local_e8.segment._0_4_ = local_118.segment._0_4_;
          local_e8.segment._4_4_ = local_118.segment._4_4_;
          local_e8.capTable._0_4_ = local_118.capTable._0_4_;
          local_e8.capTable._4_4_ = local_118.capTable._4_4_;
          local_e8.nestingLimit = local_118.nestingLimit;
          if (local_118.pointerCount < 2) {
            local_e8.segment._0_4_ = 0;
            local_e8.segment._4_4_ = 0;
            local_e8.capTable._0_4_ = 0;
            local_e8.capTable._4_4_ = 0;
            local_e8.nestingLimit = 0x7fffffff;
            local_e8.pointer = (WirePointer *)0x0;
          }
          capnp::_::PointerReader::getList(&local_60,&local_e8,INLINE_COMPOSITE,(word *)0x0);
          traverseAnnotations(this,(Reader *)&local_60,eagerness,local_c0,finalLoader,sourceInfo);
          EVar3 = EVar3 + 1;
          seen = local_c0;
          schemaNode = local_b8;
        } while (local_90.elementCount != EVar3);
      }
      break;
    case 4:
    case 5:
      bVar4 = (schemaNode->_reader).pointerCount < 4;
      local_118.data = (schemaNode->_reader).pointers + 3;
      if (bVar4) {
        local_118.data = (WirePointer *)0x0;
      }
      local_118.pointers._0_4_ = (schemaNode->_reader).nestingLimit;
      if (bVar4) {
        uVar5 = 0;
        uVar6 = 0;
        uVar7 = 0;
        uVar8 = 0;
        local_118.pointers._0_4_ = 0x7fffffff;
      }
      else {
        uVar5 = *(undefined4 *)&(schemaNode->_reader).segment;
        uVar6 = *(undefined4 *)((long)&(schemaNode->_reader).segment + 4);
        uVar7 = *(undefined4 *)&(schemaNode->_reader).capTable;
        uVar8 = *(undefined4 *)((long)&(schemaNode->_reader).capTable + 4);
      }
      local_118.segment = (SegmentReader *)CONCAT44(uVar6,uVar5);
      local_118.capTable = (CapTableReader *)CONCAT44(uVar8,uVar7);
      capnp::_::PointerReader::getStruct
                ((StructReader *)&local_90,(PointerReader *)&local_118,(word *)0x0);
      traverseType(this,(Reader *)&local_90,eagerness,seen,finalLoader,sourceInfo);
    }
  }
  bVar4 = (schemaNode->_reader).pointerCount < 3;
  local_118.data = (schemaNode->_reader).pointers + 2;
  if (bVar4) {
    local_118.data = (WirePointer *)0x0;
  }
  local_118.pointers._0_4_ = (schemaNode->_reader).nestingLimit;
  if (bVar4) {
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
    local_118.pointers._0_4_ = 0x7fffffff;
  }
  else {
    uVar5 = *(undefined4 *)&(schemaNode->_reader).segment;
    uVar6 = *(undefined4 *)((long)&(schemaNode->_reader).segment + 4);
    uVar7 = *(undefined4 *)&(schemaNode->_reader).capTable;
    uVar8 = *(undefined4 *)((long)&(schemaNode->_reader).capTable + 4);
  }
  local_118.segment = (SegmentReader *)CONCAT44(uVar6,uVar5);
  local_118.capTable = (CapTableReader *)CONCAT44(uVar8,uVar7);
  capnp::_::PointerReader::getList
            (&local_90,(PointerReader *)&local_118,INLINE_COMPOSITE,(word *)0x0);
  traverseAnnotations(this,(Reader *)&local_90,eagerness,seen,finalLoader,sourceInfo);
  return;
}

Assistant:

void Compiler::Node::traverseNodeDependencies(
    const schema::Node::Reader& schemaNode, uint eagerness,
    std::unordered_map<Node*, uint>& seen,
    const SchemaLoader& finalLoader,
    kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  switch (schemaNode.which()) {
    case schema::Node::STRUCT:
      for (auto field: schemaNode.getStruct().getFields()) {
        switch (field.which()) {
          case schema::Field::SLOT:
            traverseType(field.getSlot().getType(), eagerness, seen, finalLoader, sourceInfo);
            break;
          case schema::Field::GROUP:
            // Aux node will be scanned later.
            break;
        }

        traverseAnnotations(field.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
      }
      break;

    case schema::Node::ENUM:
      for (auto enumerant: schemaNode.getEnum().getEnumerants()) {
        traverseAnnotations(enumerant.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
      }
      break;

    case schema::Node::INTERFACE: {
      auto interface = schemaNode.getInterface();
      for (auto superclass: interface.getSuperclasses()) {
        uint64_t superclassId = superclass.getId();
        if (superclassId != 0) {  // if zero, we reported an error earlier
          traverseDependency(superclassId, eagerness, seen, finalLoader, sourceInfo);
        }
        traverseBrand(superclass.getBrand(), eagerness, seen, finalLoader, sourceInfo);
      }
      for (auto method: interface.getMethods()) {
        traverseDependency(
            method.getParamStructType(), eagerness, seen, finalLoader, sourceInfo, true);
        traverseBrand(method.getParamBrand(), eagerness, seen, finalLoader, sourceInfo);
        traverseDependency(
            method.getResultStructType(), eagerness, seen, finalLoader, sourceInfo, true);
        traverseBrand(method.getResultBrand(), eagerness, seen, finalLoader, sourceInfo);
        traverseAnnotations(method.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
      }
      break;
    }

    case schema::Node::CONST:
      traverseType(schemaNode.getConst().getType(), eagerness, seen, finalLoader, sourceInfo);
      break;

    case schema::Node::ANNOTATION:
      traverseType(schemaNode.getAnnotation().getType(), eagerness, seen, finalLoader, sourceInfo);
      break;

    default:
      break;
  }

  traverseAnnotations(schemaNode.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
}